

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O1

void __thiscall
txvalidationcache_tests::tx_mempool_block_doublespend::test_method
          (tx_mempool_block_doublespend *this)

{
  CKey *this_00;
  long *plVar1;
  uint uVar2;
  long lVar3;
  element_type *peVar4;
  CTxMemPool *pCVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer psVar13;
  bool bVar14;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  Chainstate *pCVar15;
  RecursiveMutex *pRVar16;
  long lVar17;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar18;
  uint256 *puVar19;
  undefined8 *puVar20;
  iterator pvVar21;
  lazy_ostream *plVar22;
  iterator pvVar23;
  long in_FS_OFFSET;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar33;
  undefined4 local_434;
  undefined8 local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  assertion_result local_248;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> spends;
  anon_class_8_1_8991fb9c ToMemPool;
  undefined1 local_1b8 [8];
  assertion_result local_1b0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> oneSpend;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  undefined1 local_168 [16];
  undefined1 local_158 [12];
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  pointer local_108;
  undefined3 local_100;
  CScript scriptPubKey;
  uint256 hash;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_88 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  bVar24 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  _local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  this_00 = &(this->super_Dersig100Setup).super_TestChain100Setup.coinbaseKey;
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  this_01 = &CScript::operator<<((CScript *)local_168,&vchSig)->super_CScriptBase;
  uVar2 = this_01->_size;
  uVar6 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar6 = uVar2;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_01->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar18 = this_01;
  }
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar18->_union + (long)(int)uVar6),(uchar *)&local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,this_01);
  pvVar10 = (void *)CONCAT17(vchSig.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._7_1_,
                             CONCAT16(vchSig.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                      CONCAT15(vchSig.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                               CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)))))));
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,CONCAT17(vchSig.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                     CONCAT16(vchSig.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _6_1_,CONCAT15(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) - (long)pvVar10);
  }
  if (0x1c < uStack_14c) {
    free((void *)local_168._0_8_);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_168._8_8_;
    local_168 = auVar11 << 0x40;
  }
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ToMemPool.this = this;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::resize(&spends,2);
  lVar17 = 0;
  do {
    *(undefined4 *)
     ((long)&(spends.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start)->version + lVar17) = 1;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               ((long)&((spends.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vin).
                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17),1);
    peVar4 = (((this->super_Dersig100Setup).super_TestChain100Setup.m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    plVar1 = (long *)((long)&((spends.
                               super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                               ._M_impl.super__Vector_impl_data._M_start)->vin).
                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17);
    puVar20 = (undefined8 *)*plVar1;
    uVar7 = *(undefined8 *)&(peVar4->hash).m_wrapped;
    uVar8 = *(undefined8 *)((long)&peVar4->hash + 8);
    uVar9 = *(undefined8 *)((long)&peVar4->hash + 0x18);
    puVar20[2] = *(undefined8 *)((long)&peVar4->hash + 0x10);
    puVar20[3] = uVar9;
    *puVar20 = uVar7;
    puVar20[1] = uVar8;
    *(undefined4 *)(*plVar1 + 0x20) = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(plVar1 + 3),1);
    puVar20 = *(undefined8 **)
               ((long)&((spends.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vout).
                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
    *puVar20 = 11000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar20 + 1),
               &scriptPubKey.super_CScriptBase);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_168._8_8_;
    local_168 = auVar12 << 0x40;
    pvVar21 = (iterator)0x1;
    plVar22 = (lazy_ostream *)local_168;
    SignatureHash<CMutableTransaction>
              (&hash,(CScript *)&scriptPubKey.super_CScriptBase,
               (CMutableTransaction *)
               ((long)&((spends.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vin).
                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17),0,1,(CAmount *)local_168,BASE,
               (PrecomputedTransactionData *)0x0);
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x3e;
    file.m_begin = (iterator)&local_1e8;
    msg.m_end = (iterator)plVar22;
    msg.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f8,msg);
    _cVar33 = 0x6c3e16;
    bVar14 = CKey::Sign(this_00,&hash,&vchSig,true,0);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar14;
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0._0_8_ = anon_var_dwarf_1b62a6c;
    local_1b0.m_message.px = (element_type *)(anon_var_dwarf_1b62a6c + 0x1e);
    local_168[8] = 0;
    local_168._0_8_ = &PTR__lazy_ostream_013d3df0;
    stack0xfffffffffffffeb0 = &local_1b0;
    local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_200 = "";
    pvVar21 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_168,1,0,WARN,_cVar33,(size_t)&local_208,0x3e);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    local_168[0] = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vchSig,(uchar *)local_168);
    CScript::operator<<((CScript *)
                        (*(long *)((long)&((spends.
                                            super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->vin).
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar17) + 0x28),&vchSig
                       );
    pvVar10 = (void *)CONCAT17(vchSig.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._7_1_,
                               CONCAT16(vchSig.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                        CONCAT15(vchSig.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                                 CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)))))));
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,CONCAT17(vchSig.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                       CONCAT16(vchSig.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _6_1_,CONCAT15(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)vchSig.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) - (long)pvVar10);
    }
    lVar17 = lVar17 + 0x38;
  } while (lVar17 == 0x38);
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  _local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_100 = 0;
  pvVar23 = (iterator)0x0;
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&hash,(TestChain100Setup *)this,&spends,&scriptPubKey,(Chainstate *)0x0);
  puVar19 = &hash;
  puVar20 = (undefined8 *)local_168;
  for (lVar17 = 10; psVar13 = local_108, auVar11 = local_118, lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar20 = *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
    puVar19 = (uint256 *)((long)puVar19 + (ulong)bVar24 * -0x10 + 8);
    puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
  }
  local_118._8_8_ =
       local_88[0].
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_118._0_8_ =
       local_88[0].
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108 = local_88[0].
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar13;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar13 >> 8);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar13 >> 0x10);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar13 >> 0x18);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar13 >> 0x20);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar13 >> 0x28);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar13 >> 0x30);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar13 >> 0x38);
  local_88[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = auVar11[0];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = auVar11[1];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = auVar11[2];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._3_1_ = auVar11[3];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._4_1_ = auVar11[4];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._5_1_ = auVar11[5];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._6_1_ = auVar11[6];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._7_1_ = auVar11[7];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = auVar11[8];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._1_1_ = auVar11[9];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._2_1_ = auVar11[10];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._3_1_ = auVar11[0xb];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._4_1_ = auVar11[0xc];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._5_1_ = auVar11[0xd];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._6_1_ = auVar11[0xe];
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._7_1_ = auVar11[0xf];
  local_88[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&vchSig);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(local_88);
  oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._0_9_ = ZEXT89(0x13e7538);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x49;
  file_00.m_begin = (iterator)&local_218;
  msg_00.m_end = pvVar21;
  msg_00.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228,
             msg_00);
  pCVar15 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar19 = (pCVar15->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar19 != (uint256 *)0x0) {
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 8);
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x10);
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x18);
    _cVar33 = 0x6c4131;
    CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
    auVar29[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar29[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar29[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._2_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar29[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._3_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar29[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar29[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._5_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar29[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._6_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar29[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._7_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar29[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar29[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar29[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar29[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar29[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar29[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar29[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar29[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar25[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start ==
                  hash.super_base_blob<256U>.m_data._M_elems[0]);
    auVar25[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[1]);
    auVar25[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._2_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[2]);
    auVar25[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._3_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[3]);
    auVar25[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._4_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[4]);
    auVar25[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._5_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[5]);
    auVar25[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._6_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[6]);
    auVar25[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._7_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[7]);
    auVar25[8] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                  hash.super_base_blob<256U>.m_data._M_elems[8]);
    auVar25[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish._1_1_ ==
                  hash.super_base_blob<256U>.m_data._M_elems[9]);
    auVar25[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish._2_1_ ==
                   hash.super_base_blob<256U>.m_data._M_elems[10]);
    auVar25[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar25[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar25[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar25[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar25[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar25 = auVar25 & auVar29;
    local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
    local_1b0.m_message.px = (element_type *)0x0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b62a9b;
    criticalblock17.super_unique_lock._8_8_ =
         (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
    local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
    local_248._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_250 = "";
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    local_230 = &criticalblock17;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar33,(size_t)&local_258,0x49);
    boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&oneSpend);
    local_268 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4d;
    file_01.m_begin = (iterator)&local_268;
    msg_01.m_end = pvVar23;
    msg_01.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
               msg_01);
    _cVar33 = 0x6c4250;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         test_method::anon_class_8_1_8991fb9c::operator()
                   (&ToMemPool,
                    spends.
                    super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    local_248._0_8_ = "ToMemPool(spends[0])";
    local_248.m_message.px = (element_type *)0xf95e84;
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_280 = "";
    pvVar23 = (iterator)0x0;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar33,(size_t)&local_288
               ,0x4d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pvVar21 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              ((CBlock *)&hash,(TestChain100Setup *)this,&spends,&scriptPubKey,(Chainstate *)0x0);
    puVar19 = &hash;
    puVar20 = (undefined8 *)local_168;
    for (lVar17 = 10; psVar13 = local_108, auVar11 = local_118, lVar17 != 0; lVar17 = lVar17 + -1) {
      *puVar20 = *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
      puVar19 = (uint256 *)((long)puVar19 + (ulong)bVar24 * -0x10 + 8);
      puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
    }
    local_118._8_8_ =
         local_88[0].
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118._0_8_ =
         local_88[0].
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_108 = local_88[0].
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar13;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar13 >> 8);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar13 >> 0x10);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar13 >> 0x18);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar13 >> 0x20);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar13 >> 0x28);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar13 >> 0x30);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar13 >> 0x38);
    local_88[0].
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88[0].
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = auVar11[0];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = auVar11[1];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_1_ = auVar11[2];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._3_1_ = auVar11[3];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_1_ = auVar11[4];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._5_1_ = auVar11[5];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._6_1_ = auVar11[6];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = auVar11[7];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = auVar11[8];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_1_ = auVar11[9];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._2_1_ = auVar11[10];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._3_1_ = auVar11[0xb];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_1_ = auVar11[0xc];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._5_1_ = auVar11[0xd];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._6_1_ = auVar11[0xe];
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._7_1_ = auVar11[0xf];
    local_88[0].
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&vchSig);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(local_88);
    oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._0_9_ = ZEXT89(0x13e7538);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_290 = "";
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x51;
    file_02.m_begin = (iterator)&local_298;
    msg_02.m_end = pvVar23;
    msg_02.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
               msg_02);
    pCVar15 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar19 = (pCVar15->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar19 != (uint256 *)0x0) {
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 8);
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x10);
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x18);
      _cVar33 = 0x6c443c;
      CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
      auVar30[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar30[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar30[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar30[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar30[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar30[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar30[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar30[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar30[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar30[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar30[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar30[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar30[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar30[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar30[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar30[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar26[0] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                    hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar26[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar26[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar26[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar26[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar26[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar26[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar26[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar26[8] = -((uchar)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                    hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar26[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                    hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar26[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                     hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar26[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar26[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar26[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar26[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar26[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar26 = auVar26 & auVar30;
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b62a9b;
      criticalblock17.super_unique_lock._8_8_ =
           (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2b0 = "";
      pvVar21 = (iterator)0x1;
      pvVar23 = (iterator)0x0;
      local_230 = &criticalblock17;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff);
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar33,(size_t)&local_2b8,0x51);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&oneSpend);
      local_2c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2c0 = "";
      local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x53;
      file_03.m_begin = (iterator)&local_2c8;
      msg_03.m_end = pvVar23;
      msg_03.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
                 msg_03);
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf98c4c;
      local_1b8 = (undefined1  [8])
                  CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                   super_TestingSetup.super_ChainTestingSetup.
                                   super_BasicTestingSetup.m_node.mempool._M_t.
                                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                   .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
      local_3f8 = (char *)&local_430;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_1b8 == (undefined1  [8])0x1);
      local_430._0_4_ = 1;
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b5e11b;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0xf95deb;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0x30;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = 0x3d;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = 0x3d;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0x81;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3e;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      pvVar21 = (iterator)0x1;
      pvVar23 = (iterator)0x2;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf91eb0,(size_t)&oneSpend,0x53,
                 &hash,"1U",(uint256 *)&vchSig);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      pRVar16 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                  super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                  super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = (uchar)pRVar16;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)pRVar16 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)pRVar16 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)pRVar16 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)pRVar16 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)pRVar16 >> 0x28);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)pRVar16 >> 0x30);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)pRVar16 >> 0x38);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&vchSig);
      pCVar5 = (this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
      CTransaction::CTransaction
                ((CTransaction *)&hash,
                 spends.
                 super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      CTxMemPool::removeRecursive(pCVar5,(CTransaction *)&hash,CONFLICT);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                 (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&vchSig);
      local_2e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_2e0 = "";
      local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x55;
      file_04.m_begin = (iterator)&local_2e8;
      msg_04.m_end = pvVar23;
      msg_04.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
                 msg_04);
      local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
      local_248._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf98c4c;
      local_1b8 = (undefined1  [8])
                  CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                   super_TestingSetup.super_ChainTestingSetup.
                                   super_BasicTestingSetup.m_node.mempool._M_t.
                                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                   .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      local_430 = (ulong)local_430._4_4_ << 0x20;
      local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_1b8 == (undefined1  [8])0x0);
      local_1b0.m_message.px = (element_type *)0x0;
      local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b5e11b;
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0xf95deb;
      criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3f8 = (char *)&local_430;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0x30;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = 0x3d;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = 0x3d;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0x81;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3e;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      pvVar21 = (iterator)0x1;
      pvVar23 = (iterator)0x2;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
      boost::test_tools::tt_detail::report_assertion
                (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf91eb0,(size_t)&oneSpend,0x55,
                 &hash,"0U",(unique_lock<std::recursive_mutex> *)&vchSig);
      boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = &DAT_00000058;
      file_05.m_begin = (iterator)&local_308;
      msg_05.m_end = pvVar23;
      msg_05.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_318,
                 msg_05);
      _cVar33 = 0x6c48c6;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           test_method::anon_class_8_1_8991fb9c::operator()
                     (&ToMemPool,
                      spends.
                      super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._3_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_248._0_8_ = "ToMemPool(spends[1])";
      local_248.m_message.px = (element_type *)0xf95e99;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_328 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_320 = "";
      pvVar23 = (iterator)0x0;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar33,
                 (size_t)&local_328,0x58);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar21 = (iterator)0x0;
      TestChain100Setup::CreateAndProcessBlock
                ((CBlock *)&hash,(TestChain100Setup *)this,&spends,&scriptPubKey,(Chainstate *)0x0);
      puVar19 = &hash;
      puVar20 = (undefined8 *)local_168;
      for (lVar17 = 10; psVar13 = local_108, auVar11 = local_118, lVar17 != 0; lVar17 = lVar17 + -1)
      {
        *puVar20 = *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
        puVar19 = (uint256 *)((long)puVar19 + (ulong)bVar24 * -0x10 + 8);
        puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
      }
      local_118._8_8_ =
           local_88[0].
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118._0_8_ =
           local_88[0].
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108 = local_88[0].
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar13;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar13 >> 8);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar13 >> 0x10);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar13 >> 0x18);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar13 >> 0x20);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar13 >> 0x28);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar13 >> 0x30);
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar13 >> 0x38);
      local_88[0].
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88[0].
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = auVar11[0];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_1_ = auVar11[1];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._2_1_ = auVar11[2];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._3_1_ = auVar11[3];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_1_ = auVar11[4];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._5_1_ = auVar11[5];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._6_1_ = auVar11[6];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = auVar11[7];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = auVar11[8];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_1_ = auVar11[9];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._2_1_ = auVar11[10];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._3_1_ = auVar11[0xb];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_1_ = auVar11[0xc];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._5_1_ = auVar11[0xd];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = auVar11[0xe];
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = auVar11[0xf];
      local_88[0].
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&vchSig);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(local_88);
      oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl
      .super__Vector_impl_data._0_9_ = ZEXT89(0x13e7538);
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&oneSpend);
      local_338 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_330 = "";
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x5c;
      file_06.m_begin = (iterator)&local_338;
      msg_06.m_end = pvVar23;
      msg_06.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_348,
                 msg_06);
      pCVar15 = ChainstateManager::ActiveChainstate
                          ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      puVar19 = (pCVar15->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->phashBlock;
      if (puVar19 != (uint256 *)0x0) {
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 8);
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x10);
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x18);
        _cVar33 = 0x6c4ac1;
        CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
        uStack_40 = (uchar)&local_3f8;
        uStack_3f = (uchar)((ulong)&local_3f8 >> 8);
        uStack_3e = (uchar)((ulong)&local_3f8 >> 0x10);
        uStack_3d = (uchar)((ulong)&local_3f8 >> 0x18);
        uStack_3c = (uchar)((ulong)&local_3f8 >> 0x20);
        uStack_3b = (uchar)((ulong)&local_3f8 >> 0x28);
        uStack_3a = (uchar)((ulong)&local_3f8 >> 0x30);
        uStack_39 = (uchar)((ulong)&local_3f8 >> 0x38);
        auVar31[0] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar31[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar31[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar31[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar31[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar31[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar31[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar31[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar31[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar31[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar31[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar31[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar31[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar31[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar31[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar31[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar27[0] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start ==
                      hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar27[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar27[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar27[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar27[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar27[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar27[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar27[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar27[8] = -((uchar)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                      hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar27[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                      hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar27[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                       hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar27[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar27[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar27[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar27[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar27[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar27 = auVar27 & auVar31;
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b62a9b;
        criticalblock17.super_unique_lock._8_8_ =
             (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash()" + 0x47;
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_358 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_350 = "";
        pvVar21 = (iterator)0x1;
        pvVar23 = (iterator)0x0;
        local_230 = &criticalblock17;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff);
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar33,(size_t)&local_358,0x5c);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&oneSpend);
        local_368 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_360 = "";
        local_378 = &boost::unit_test::basic_cstring<char_const>::null;
        local_370 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x5e;
        file_07.m_begin = (iterator)&local_368;
        msg_07.m_end = pvVar23;
        msg_07.m_begin = pvVar21;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_378
                   ,msg_07);
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013d3cb0;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf98c4c;
        local_1b8 = (undefined1  [8])
                    CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                     super_TestingSetup.super_ChainTestingSetup.
                                     super_BasicTestingSetup.m_node.mempool._M_t.
                                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                     .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
        local_430._0_4_ = 1;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(local_1b8 == (undefined1  [8])0x1);
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b5e11b;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0xf95deb;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3f8 = (char *)&local_430;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0x30;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = 0x3d;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = 0x3d;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0x81;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3e;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        pvVar21 = (iterator)0x1;
        pvVar23 = (iterator)0x2;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf91eb0,(size_t)&oneSpend,0x5e
                   ,&hash,"1U",(uint256 *)&vchSig);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        pRVar16 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = (uchar)pRVar16;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = (uchar)((ulong)pRVar16 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = (uchar)((ulong)pRVar16 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = (uchar)((ulong)pRVar16 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = (uchar)((ulong)pRVar16 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = (uchar)((ulong)pRVar16 >> 0x28);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = (uchar)((ulong)pRVar16 >> 0x30);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = (uchar)((ulong)pRVar16 >> 0x38);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&vchSig);
        pCVar5 = (this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                 super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
        CTransaction::CTransaction
                  ((CTransaction *)&hash,
                   spends.
                   super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1);
        CTxMemPool::removeRecursive(pCVar5,(CTransaction *)&hash,CONFLICT);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&vchSig);
        local_388 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_380 = "";
        local_398 = &boost::unit_test::basic_cstring<char_const>::null;
        local_390 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x60;
        file_08.m_begin = (iterator)&local_388;
        msg_08.m_end = pvVar23;
        msg_08.m_begin = pvVar21;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_398
                   ,msg_08);
        local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
        local_248._0_8_ = &PTR__lazy_ostream_013d3cb0;
        local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf98c4c;
        local_1b8 = (undefined1  [8])
                    CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                     super_TestingSetup.super_ChainTestingSetup.
                                     super_BasicTestingSetup.m_node.mempool._M_t.
                                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                     .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
        local_430 = (ulong)local_430._4_4_ << 0x20;
        local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)(local_1b8 == (undefined1  [8])0x0);
        local_1b0.m_message.px = (element_type *)0x0;
        local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0xf95deb;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        criticalblock17.super_unique_lock._M_device = (mutex_type *)local_1b8;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3f8 = (char *)&local_430;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0x30;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = 0x3d;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = 0x3d;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0x81;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3e;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        pvVar21 = (iterator)0x1;
        pvVar23 = (iterator)0x2;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &criticalblock17;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf91eb0,(size_t)&oneSpend,0x60
                   ,&hash,"0U",(unique_lock<std::recursive_mutex> *)&vchSig);
        boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._0_9_ = 0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        oneSpend.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::push_back
                  (&oneSpend,
                   spends.
                   super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_3a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3a0 = "";
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0x65;
        file_09.m_begin = (iterator)&local_3a8;
        msg_09.m_end = pvVar23;
        msg_09.m_begin = pvVar21;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3b8
                   ,msg_09);
        _cVar33 = 0x6c4f85;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             test_method::anon_class_8_1_8991fb9c::operator()
                       (&ToMemPool,
                        spends.
                        super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._2_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._3_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_248._0_8_ = "ToMemPool(spends[1])";
        local_248.m_message.px = (element_type *)0xf95e99;
        hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
        hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_3c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3c0 = "";
        pvVar23 = (iterator)0x0;
        hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)&local_248;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&vchSig,(lazy_ostream *)&hash,1,0,WARN,_cVar33,
                   (size_t)&local_3c8,0x65);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        pvVar21 = (iterator)0x0;
        TestChain100Setup::CreateAndProcessBlock
                  ((CBlock *)&hash,(TestChain100Setup *)this,&oneSpend,&scriptPubKey,
                   (Chainstate *)0x0);
        puVar19 = &hash;
        puVar20 = (undefined8 *)local_168;
        for (lVar17 = 10; psVar13 = local_108, auVar11 = local_118, lVar17 != 0;
            lVar17 = lVar17 + -1) {
          *puVar20 = *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
          puVar19 = (uint256 *)((long)puVar19 + (ulong)bVar24 * -0x10 + 8);
          puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
        }
        local_118._8_8_ =
             local_88[0].
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_118._0_8_ =
             local_88[0].
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108 = local_88[0].
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = (uchar)psVar13;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_1_ = (uchar)((ulong)psVar13 >> 8);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = (uchar)((ulong)psVar13 >> 0x10);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = (uchar)((ulong)psVar13 >> 0x18);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)((ulong)psVar13 >> 0x20);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = (uchar)((ulong)psVar13 >> 0x28);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = (uchar)((ulong)psVar13 >> 0x30);
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)((ulong)psVar13 >> 0x38);
        local_88[0].
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88[0].
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = auVar11[0];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._1_1_ = auVar11[1];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._2_1_ = auVar11[2];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._3_1_ = auVar11[3];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_1_ = auVar11[4];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._5_1_ = auVar11[5];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._6_1_ = auVar11[6];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._7_1_ = auVar11[7];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = auVar11[8];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ = auVar11[9];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._2_1_ = auVar11[10];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._3_1_ = auVar11[0xb];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_1_ = auVar11[0xc];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._5_1_ = auVar11[0xd];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._6_1_ = auVar11[0xe];
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = auVar11[0xf];
        local_88[0].
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)&vchSig);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(local_88);
        criticalblock17.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
        criticalblock17.super_unique_lock._8_8_ =
             criticalblock17.super_unique_lock._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock17.super_unique_lock);
        local_3d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
        ;
        local_3d0 = "";
        local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0x69;
        file_10.m_begin = (iterator)&local_3d8;
        msg_10.m_end = pvVar23;
        msg_10.m_begin = pvVar21;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8
                   ,msg_10);
        pCVar15 = ChainstateManager::ActiveChainstate
                            ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup
                             .super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        puVar19 = (pCVar15->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->phashBlock;
        if (puVar19 != (uint256 *)0x0) {
          hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)(puVar19->super_base_blob<256U>).m_data._M_elems;
          hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 8);
          hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x10);
          hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((puVar19->super_base_blob<256U>).m_data._M_elems + 0x18);
          _cVar33 = 0x6c5176;
          CBlockHeader::GetHash((uint256 *)&vchSig,(CBlockHeader *)local_168);
          uStack_40 = (uchar)&local_3f8;
          uStack_3f = (uchar)((ulong)&local_3f8 >> 8);
          uStack_3e = (uchar)((ulong)&local_3f8 >> 0x10);
          uStack_3d = (uchar)((ulong)&local_3f8 >> 0x18);
          uStack_3c = (uchar)((ulong)&local_3f8 >> 0x20);
          uStack_3b = (uchar)((ulong)&local_3f8 >> 0x28);
          uStack_3a = (uchar)((ulong)&local_3f8 >> 0x30);
          uStack_39 = (uchar)((ulong)&local_3f8 >> 0x38);
          auVar32[0] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar32[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar32[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar32[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar32[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar32[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar32[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar32[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar32[8] = -(uStack_40 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar32[9] = -(uStack_3f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar32[10] = -(uStack_3e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar32[0xb] = -(uStack_3d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar32[0xc] = -(uStack_3c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar32[0xd] = -(uStack_3b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar32[0xe] = -(uStack_3a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar32[0xf] = -(uStack_39 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar28[0] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start ==
                        hash.super_base_blob<256U>.m_data._M_elems[0]);
          auVar28[1] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[1]);
          auVar28[2] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[2]);
          auVar28[3] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._3_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[3]);
          auVar28[4] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[4]);
          auVar28[5] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._5_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[5]);
          auVar28[6] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._6_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[6]);
          auVar28[7] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._7_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[7]);
          auVar28[8] = -((uchar)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                        hash.super_base_blob<256U>.m_data._M_elems[8]);
          auVar28[9] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                        hash.super_base_blob<256U>.m_data._M_elems[9]);
          auVar28[10] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                         hash.super_base_blob<256U>.m_data._M_elems[10]);
          auVar28[0xb] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar28[0xc] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar28[0xd] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar28[0xe] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar28[0xf] = -(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                          hash.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar28 = auVar28 & auVar32;
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_3f8 = "m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash()";
          local_3f0 = "";
          local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
          local_248._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_3f8;
          local_408 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
          ;
          local_400 = "";
          pvVar21 = (iterator)0x1;
          pvVar23 = (iterator)0x0;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff);
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)&local_248,1,0,WARN,_cVar33,(size_t)&local_408,0x69)
          ;
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
          local_418 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
          ;
          local_410 = "";
          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
          local_420 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0x6d;
          file_11.m_begin = (iterator)&local_418;
          msg_11.m_end = pvVar23;
          msg_11.m_begin = pvVar21;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_428,msg_11);
          local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
          local_248._0_8_ = &PTR__lazy_ostream_013d3cb0;
          local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_230 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xf98c4c;
          local_430 = CTxMemPool::size((this->super_Dersig100Setup).super_TestChain100Setup.
                                       super_TestingSetup.super_ChainTestingSetup.
                                       super_BasicTestingSetup.m_node.mempool._M_t.
                                       super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                       .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          local_1b8 = (undefined1  [8])&local_434;
          local_434 = 0;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(local_430 == 0);
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          criticalblock17.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1b5e11b;
          criticalblock17.super_unique_lock._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
               + 0x69;
          local_3f8 = (char *)&local_430;
          hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
          hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
          hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
          hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_3f8;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0x30;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._1_1_ = 0x3d;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._2_1_ = 0x3d;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._3_1_ = 1;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._4_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._5_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._6_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._7_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._1_1_ = 0x81;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = 0x3e;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)&local_248,1,2,REQUIRE,0xf91eb0,
                     (size_t)&criticalblock17,0x6d,&hash,"0U",(uint256 *)&vchSig);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&oneSpend)
          ;
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)local_118);
          std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&spends);
          if (0x1c < scriptPubKey.super_CScriptBase._size) {
            free(scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
            scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
            return;
          }
          __stack_chk_fail();
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_block_doublespend, Dersig100Setup)
{
    // Make sure skipping validation of transactions that were
    // validated going into the memory pool does not allow
    // double-spends in blocks to pass validation when they should not.

    CScript scriptPubKey = CScript() <<  ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    const auto ToMemPool = [this](const CMutableTransaction& tx) {
        LOCK(cs_main);

        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(tx));
        return result.m_result_type == MempoolAcceptResult::ResultType::VALID;
    };

    // Create a double-spend of mature coinbase txn:
    std::vector<CMutableTransaction> spends;
    spends.resize(2);
    for (int i = 0; i < 2; i++)
    {
        spends[i].version = 1;
        spends[i].vin.resize(1);
        spends[i].vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
        spends[i].vin[0].prevout.n = 0;
        spends[i].vout.resize(1);
        spends[i].vout[0].nValue = 11*CENT;
        spends[i].vout[0].scriptPubKey = scriptPubKey;

        // Sign:
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(scriptPubKey, spends[i], 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spends[i].vin[0].scriptSig << vchSig;
    }

    CBlock block;

    // Test 1: block with both of those transactions should be rejected.
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }

    // Test 2: ... and should be rejected if spend1 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[0]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[0]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Test 3: ... and should be rejected if spend2 is in the memory pool
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(spends, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() != block.GetHash());
    }
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 1U);
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->removeRecursive(CTransaction{spends[1]}, MemPoolRemovalReason::CONFLICT));
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);

    // Final sanity test: first spend in *m_node.mempool, second in block, that's OK:
    std::vector<CMutableTransaction> oneSpend;
    oneSpend.push_back(spends[0]);
    BOOST_CHECK(ToMemPool(spends[1]));
    block = CreateAndProcessBlock(oneSpend, scriptPubKey);
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    }
    // spends[1] should have been removed from the mempool when the
    // block with spends[0] is accepted:
    BOOST_CHECK_EQUAL(m_node.mempool->size(), 0U);
}